

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetOutputNameArtifactResultGetter<ArtifactLinkerTag>::Get_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetOutputNameArtifactResultGetter<ArtifactLinkerTag> *this,cmGeneratorTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  size_type *psVar1;
  bool bVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  _Base_ptr *config;
  string local_60;
  string local_40;
  
  bVar2 = cmGeneratorTarget::IsLinkable((cmGeneratorTarget *)this);
  if (!bVar2) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_40,(GeneratorExpressionContent *)context);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "TARGET_LINKER_FILE_BASE_NAME is allowed only for libraries and executables with ENABLE_EXPORTS."
               ,"");
    reportError((cmGeneratorExpressionContext *)target,&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  config = &(target->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  bVar2 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)this,(string *)config);
  cmGeneratorTarget::GetOutputName(&local_40,(cmGeneratorTarget *)this,(string *)config,(uint)bVar2)
  ;
  cmGeneratorTarget::GetFilePostfix(&local_60,(cmGeneratorTarget *)this,(string *)config);
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    uVar4 = local_40.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar4 < local_60._M_string_length + local_40._M_string_length) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar4 = local_60.field_2._M_allocated_capacity;
    }
    if (local_60._M_string_length + local_40._M_string_length <= (ulong)uVar4) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_60,0,(char *)0x0,(ulong)local_40._M_dataplus._M_p);
      goto LAB_0050fa36;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60._M_dataplus._M_p);
LAB_0050fa36:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar4 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Get(cmGeneratorTarget* target,
                         cmGeneratorExpressionContext* context,
                         const GeneratorExpressionContent* content)
  {
    // The file used to link to the target (.so, .lib, .a).
    if (!target->IsLinkable()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_LINKER_FILE_BASE_NAME is allowed only for "
                    "libraries and executables with ENABLE_EXPORTS.");
      return std::string();
    }
    cmStateEnums::ArtifactType artifact =
      target->HasImportLibrary(context->Config)
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    return target->GetOutputName(context->Config, artifact) +
      target->GetFilePostfix(context->Config);
  }